

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeGetAddress(ExpressionContext *ctx,SynGetAddress *syntax)

{
  int iVar1;
  SynBase *value;
  ExprBase *pEVar2;
  undefined4 extraout_var;
  TypeBase *pTVar3;
  
  value = (SynBase *)AnalyzeExpression(ctx,syntax->value);
  if (((TypeBase *)value->end != (TypeBase *)0x0) && (((TypeBase *)value->end)->typeID == 0)) {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar2 = (ExprBase *)CONCAT44(extraout_var,iVar1);
    pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar2->typeID = 0;
    pEVar2->source = &syntax->super_SynBase;
    pEVar2->type = pTVar3;
    pEVar2->next = (ExprBase *)0x0;
    pEVar2->listed = false;
    pEVar2->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00248b28;
    pEVar2[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar2[1]._vptr_ExprBase = (_func_int **)&pEVar2[1].source;
    *(undefined8 *)&pEVar2[1].typeID = 0x400000001;
    pEVar2[1].source = value;
    return pEVar2;
  }
  pEVar2 = CreateGetAddress(ctx,&syntax->super_SynBase,(ExprBase *)value);
  return pEVar2;
}

Assistant:

ExprBase* AnalyzeGetAddress(ExpressionContext &ctx, SynGetAddress *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

	return CreateGetAddress(ctx, syntax, value);
}